

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)

{
  uint uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  ulong local_38;
  size_t i;
  sysbvm_tuple_t *slots;
  size_t slotCount;
  sysbvm_object_tuple_t *object;
  sysbvm_heap_mallocObjectHeader_t *objectHeader;
  sysbvm_heap_t *heap_local;
  
  for (object = (sysbvm_object_tuple_t *)heap->firstMallocObject;
      object != (sysbvm_object_tuple_t *)0x0;
      object = *(sysbvm_object_tuple_t **)&(object->header).field_0) {
    uVar3 = sysbvm_tuple_getGCColor((sysbvm_tuple_t)&object->field_1);
    if ((uVar3 == heap->gcBlackColor) &&
       (_Var2 = sysbvm_tuple_isWeakObject((sysbvm_tuple_t)&object->field_1), _Var2)) {
      uVar1 = object[1].header.field_0.field_1.typePointer32Padding;
      for (local_38 = 0; local_38 < uVar1 >> 3; local_38 = local_38 + 1) {
        _Var2 = sysbvm_tuple_isNonNullPointer
                          (*(sysbvm_tuple_t *)
                            (&object[1].header.identityHashAndFlags + local_38 * 2));
        if ((_Var2) &&
           (uVar3 = sysbvm_tuple_getGCColor
                              (*(sysbvm_tuple_t *)
                                (&object[1].header.identityHashAndFlags + local_38 * 2)),
           uVar3 != heap->gcBlackColor)) {
          *(undefined8 *)(&object[1].header.identityHashAndFlags + local_38 * 2) = 0x4f;
        }
      }
    }
  }
  return;
}

Assistant:

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)
{
    sysbvm_heap_mallocObjectHeader_t *objectHeader = heap->firstMallocObject;
    while(objectHeader)
    {
        sysbvm_object_tuple_t *object = (sysbvm_object_tuple_t*)(objectHeader + 1);
        if(sysbvm_tuple_getGCColor((sysbvm_tuple_t)object) == heap->gcBlackColor)
        {
            // Only check the slots of weak objects.
            if(sysbvm_tuple_isWeakObject((sysbvm_tuple_t)object))
            {
                size_t slotCount = object->header.objectSize / sizeof(sysbvm_tuple_t);
                sysbvm_tuple_t *slots = object->pointers;

                for(size_t i = 0; i < slotCount; ++i)
                {
                    if(sysbvm_tuple_isNonNullPointer(slots[i]) && sysbvm_tuple_getGCColor(slots[i]) != heap->gcBlackColor)
                        slots[i] = SYSBVM_TOMBSTONE_TUPLE;
                }
            }
        }

        objectHeader = objectHeader->next;
    }
}